

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializePayload0.cpp
# Opt level: O0

void trackerboy::deserializePayload0TU::readListIndex<trackerboy::Instrument>
               (InputBlock *block,size_t count,Table<trackerboy::Instrument> *list)

{
  Instrument *this;
  InputBlock *block_00;
  string local_50;
  Instrument *local_30;
  Instrument *item;
  Table<trackerboy::Instrument> *pTStack_20;
  uint8_t id;
  Table<trackerboy::Instrument> *list_local;
  size_t count_local;
  InputBlock *block_local;
  
  pTStack_20 = list;
  list_local = (Table<trackerboy::Instrument> *)count;
  count_local = (size_t)block;
  while (list_local != (Table<trackerboy::Instrument> *)0x0) {
    list_local = (Table<trackerboy::Instrument> *)&list_local[-1].field_0x3f;
    InputBlock::read<unsigned_char>((InputBlock *)count_local,(uchar *)((long)&item + 7));
    this = Table<trackerboy::Instrument>::insert(pTStack_20,(uint)item._7_1_);
    local_30 = this;
    deserializeString_abi_cxx11_(&local_50,(deserializePayload0TU *)count_local,block_00);
    Named::setName(&this->super_Named,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void readListIndex(InputBlock &block, size_t count, Table<T> &list) {
    while (count--) {
        uint8_t id;
        block.read(id);
        auto item = list.insert(id);
        item->setName(TU::deserializeString(block));
    }
}